

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void qpixl::frqi::isfwht<std::vector<float,std::allocator<float>>>
               (vector<float,_std::allocator<float>_> *a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  size_type x_00;
  size_type __n;
  reference pvVar5;
  T x;
  size_t j1;
  size_t i;
  size_t j;
  size_t k;
  size_t n;
  vector<float,_std::allocator<float>_> *a_local;
  
  x_00 = std::vector<float,_std::allocator<float>_>::size(a);
  bVar4 = ispow2(x_00);
  if (!bVar4) {
    __assert_fail("qpixl::ispow2( n )",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/include/qpixl/frqi/util.hpp"
                  ,0x36,"void qpixl::frqi::isfwht(V &) [V = std::vector<float>]");
  }
  ilog2(x_00);
  for (i = 1; i < x_00; i = i << 1) {
    for (j1 = 0; j1 < x_00; j1 = j1 + 1) {
      if ((j1 & i) == 0) {
        __n = j1 + i;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](a,j1);
        fVar1 = *pvVar5;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](a,j1);
        fVar2 = *pvVar5;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](a,__n);
        fVar3 = *pvVar5;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](a,j1);
        *pvVar5 = fVar2 + fVar3;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](a,__n);
        fVar2 = *pvVar5;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](a,__n);
        *pvVar5 = fVar1 - fVar2;
      }
    }
  }
  return;
}

Assistant:

void isfwht( V& a ) {
    using T = typename V::value_type ;
    size_t n = a.size() ;
    assert( qpixl::ispow2( n ) ) ;
    size_t k = qpixl::ilog2( n ) ;

    for ( size_t j = 1; j < n; j*=2 ) {
      #pragma omp parallel for
      for ( size_t i = 0; i < n; i++ ) {
        if ( ( i & j ) == 0 ) {
          const size_t j1 = i + j ;
          const T x = a[i] ;

          a[i]  = ( a[i] + a[j1] ) ;
          a[j1] = ( x    - a[j1] ) ;
        }
      }
    }
  }